

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::OuterProduct<2,_3>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<2,_3> *this,EvalContext *ctx,IArgs *iargs)

{
  Vector<tcu::Interval,_3> *pVVar1;
  long lVar2;
  Mul *pMVar3;
  long lVar4;
  bool *pbVar5;
  undefined1 local_8a;
  undefined1 local_89;
  IRet *local_88;
  long local_80;
  long local_78;
  IRet *local_70;
  bool *local_68;
  bool *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  undefined8 local_38;
  
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix(__return_storage_ptr__);
  lVar2 = 0;
  local_88 = __return_storage_ptr__;
  do {
    local_78 = lVar2 * 0x18;
    lVar4 = 0;
    local_80 = lVar2;
    local_70 = __return_storage_ptr__;
    do {
      pbVar5 = &iargs->a->m_data[0].m_hasNaN + local_78;
      pVVar1 = iargs->b;
      pMVar3 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Mul>();
      local_50 = &local_8a;
      local_68 = pbVar5;
      local_60 = &pVVar1->m_data[0].m_hasNaN + lVar4;
      local_58 = &local_89;
      (**(code **)((long)*pMVar3 + 0x40))(&local_48,pMVar3,ctx,&local_68);
      *(undefined8 *)((long)&(local_70->m_data).m_data[0].m_data[0].m_hi + lVar4 * 2) = local_38;
      pbVar5 = &(local_70->m_data).m_data[0].m_data[0].m_hasNaN + lVar4 * 2;
      *(undefined8 *)pbVar5 = local_48;
      *(double *)(pbVar5 + 8) = dStack_40;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
    lVar2 = local_80 + 1;
    __return_storage_ptr__ = (IRet *)((local_70->m_data).m_data[0].m_data + 1);
  } while (local_80 == 0);
  return local_88;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}